

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.cc
# Opt level: O3

void google::protobuf::internal::RepeatedFieldHelper<1>::
     Serialize<google::protobuf::internal::ArrayOutput>
               (void *field,FieldMetadata *md,ArrayOutput *output)

{
  bool bVar1;
  byte *pbVar2;
  byte *pbVar3;
  long lVar4;
  uint uVar5;
  uint uVar6;
  
  if (0 < *field) {
    pbVar2 = output->ptr;
    lVar4 = 0;
    do {
      uVar5 = md->tag;
      if (uVar5 < 0x80) {
        *pbVar2 = (byte)uVar5;
        pbVar2 = pbVar2 + 1;
      }
      else {
        *pbVar2 = (byte)uVar5 | 0x80;
        if (uVar5 < 0x4000) {
          pbVar2[1] = (byte)(uVar5 >> 7);
          pbVar2 = pbVar2 + 2;
        }
        else {
          pbVar2 = pbVar2 + 2;
          uVar5 = uVar5 >> 7;
          do {
            pbVar3 = pbVar2;
            pbVar3[-1] = (byte)uVar5 | 0x80;
            uVar6 = uVar5 >> 7;
            pbVar2 = pbVar3 + 1;
            bVar1 = 0x3fff < uVar5;
            uVar5 = uVar6;
          } while (bVar1);
          *pbVar3 = (byte)uVar6;
        }
      }
      *(undefined8 *)pbVar2 = *(undefined8 *)(*(long *)((long)field + 8) + lVar4 * 8);
      pbVar2 = pbVar2 + 8;
      output->ptr = pbVar2;
      lVar4 = lVar4 + 1;
    } while (lVar4 < *field);
  }
  return;
}

Assistant:

static void Serialize(const void* field, const FieldMetadata& md, O* output) {
    typedef typename PrimitiveTypeHelper<type>::Type T;
    const RepeatedField<T>& array = Get<RepeatedField<T> >(field);
    for (int i = 0; i < array.size(); i++) {
      WriteTagTo(md.tag, output);
      SerializeTo<type>(&array[i], output);
    }
  }